

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O0

bool __thiscall
Lowerer::GenerateSimplifiedInt4Rem(Lowerer *this,Instr *remInstr,LabelInstr *skipBailOutLabel)

{
  code *pcVar1;
  bool bVar2;
  bool bVar3;
  OpCode OVar4;
  BailOutKind BVar5;
  uint sourceContextId;
  uint functionId;
  int32 iVar6;
  undefined4 *puVar7;
  Opnd *this_00;
  Opnd *src1_00;
  Opnd *this_01;
  Func *pFVar8;
  LabelInstr *target;
  IntConstOpnd *pIVar9;
  IntConstOpnd *pIStack_60;
  int32 mask;
  Opnd *maskOpnd;
  LabelInstr *slowPathLabel;
  LabelInstr *doneLabel;
  bool isModByPowerOf2;
  Opnd *src2;
  Opnd *src1;
  Opnd *dst;
  LabelInstr *skipBailOutLabel_local;
  Instr *remInstr_local;
  Lowerer *this_local;
  
  if (remInstr == (Instr *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar7 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x6768,"(remInstr)","remInstr");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar7 = 0;
  }
  if ((remInstr->m_opcode != Rem_I4) && (remInstr->m_opcode != RemU_I4)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar7 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x6769,
                       "(remInstr->m_opcode == Js::OpCode::Rem_I4 || remInstr->m_opcode == Js::OpCode::RemU_I4)"
                       ,
                       "remInstr->m_opcode == Js::OpCode::Rem_I4 || remInstr->m_opcode == Js::OpCode::RemU_I4"
                      );
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar7 = 0;
  }
  this_00 = IR::Instr::GetDst(remInstr);
  src1_00 = IR::Instr::GetSrc1(remInstr);
  this_01 = IR::Instr::GetSrc2(remInstr);
  if ((src1_00 == (Opnd *)0x0) || (this_01 == (Opnd *)0x0)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar7 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x676d,"(src1 && src2)","src1 && src2");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar7 = 0;
  }
  bVar2 = IR::Opnd::IsRegOpnd(this_00);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar7 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x676e,"(dst->IsRegOpnd())","dst->IsRegOpnd()");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar7 = 0;
  }
  bVar3 = IR::Instr::HasBailOutInfo(remInstr);
  bVar2 = false;
  if (bVar3) {
    BVar5 = IR::Instr::GetBailOutKind(remInstr);
    bVar2 = BVar5 == BailOnModByPowerOf2;
  }
  pFVar8 = Func::GetTopFunc(remInstr->m_func);
  sourceContextId = Func::GetSourceContextId(pFVar8);
  pFVar8 = Func::GetTopFunc(remInstr->m_func);
  functionId = Func::GetLocalFunctionId(pFVar8);
  bVar3 = Js::Phases::IsEnabled
                    ((Phases *)&DAT_01eafdf0,MathFastPathPhase,sourceContextId,functionId);
  if ((bVar3) && (!bVar2)) {
    return false;
  }
  bVar3 = IR::Opnd::IsIntConstOpnd(this_01);
  if (bVar3) {
    pIVar9 = IR::Opnd::AsIntConstOpnd(this_01);
    iVar6 = IR::IntConstOpnd::AsInt32(pIVar9);
    bVar3 = Math::IsPow2(iVar6);
    if (bVar3) goto LAB_00797472;
  }
  if (bVar2 == false) {
    return false;
  }
LAB_00797472:
  slowPathLabel = skipBailOutLabel;
  if (skipBailOutLabel == (LabelInstr *)0x0) {
    slowPathLabel = IR::LabelInstr::New(Label,remInstr->m_func,false);
    IR::Instr::InsertAfter(remInstr,&slowPathLabel->super_Instr);
  }
  target = IR::LabelInstr::New(Label,remInstr->m_func,bVar2);
  IR::Instr::InsertBefore(remInstr,&target->super_Instr);
  InsertTest(src1_00,src1_00,&target->super_Instr);
  OVar4 = LowererMD::MDCompareWithZeroBranchOpcode(BrLt_A);
  InsertBranch(OVar4,target,&target->super_Instr);
  if (bVar2 == false) {
    bVar2 = IR::Opnd::IsIntConstOpnd(this_01);
    if (!bVar2) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar7 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                         ,0x67ad,"(src2->IsIntConstOpnd())","src2->IsIntConstOpnd()");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar7 = 0;
    }
    pIVar9 = IR::Opnd::AsIntConstOpnd(this_01);
    iVar6 = IR::IntConstOpnd::AsInt32(pIVar9);
    pIStack_60 = IR::IntConstOpnd::New((long)(iVar6 + -1),TyInt32,remInstr->m_func,false);
  }
  else {
    if (bVar2 == false) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar7 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                         ,0x679c,"(isModByPowerOf2)","isModByPowerOf2");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar7 = 0;
    }
    pIStack_60 = (IntConstOpnd *)IR::RegOpnd::New(TyInt32,remInstr->m_func);
    InsertMove((Opnd *)pIStack_60,this_01,&target->super_Instr,true);
    pIVar9 = IR::IntConstOpnd::New(1,TyInt32,this->m_func,true);
    InsertSub(true,(Opnd *)pIStack_60,(Opnd *)pIStack_60,&pIVar9->super_Opnd,&target->super_Instr);
    OVar4 = LowererMD::MDCompareWithZeroBranchOpcode(BrLt_A);
    InsertBranch(OVar4,target,&target->super_Instr);
    InsertTestBranch(this_01,(Opnd *)pIStack_60,BrNeq_A,target,&target->super_Instr);
  }
  InsertAnd(this_00,src1_00,&pIStack_60->super_Opnd,&target->super_Instr);
  InsertBranch(Br,slowPathLabel,&target->super_Instr);
  return true;
}

Assistant:

bool
Lowerer::GenerateSimplifiedInt4Rem(
    IR::Instr *const remInstr,
    IR::LabelInstr *const skipBailOutLabel) const
{
    Assert(remInstr);
    Assert(remInstr->m_opcode == Js::OpCode::Rem_I4 || remInstr->m_opcode == Js::OpCode::RemU_I4);

    auto *dst = remInstr->GetDst(), *src1 = remInstr->GetSrc1(), *src2 = remInstr->GetSrc2();

    Assert(src1 && src2);
    Assert(dst->IsRegOpnd());

    bool isModByPowerOf2 = (remInstr->HasBailOutInfo() && remInstr->GetBailOutKind() == IR::BailOnModByPowerOf2);

    if (PHASE_OFF(Js::Phase::MathFastPathPhase, remInstr->m_func->GetTopFunc()) && !isModByPowerOf2)
        return false;

    if (!(src2->IsIntConstOpnd() && Math::IsPow2(src2->AsIntConstOpnd()->AsInt32())) && !isModByPowerOf2)
    {
        return false;
    }
    // We have:
    //     s3 = s1 % s2 , where s2 = +2^i
    //
    // Generate:
    //     test s1, s1
    //     js   $slowPathLabel
    //     s3 = and s1, 0x00..fff  (2^i - 1)
    //     jmp  $doneLabel
    //   $slowPathLabel:
    //     (Slow path)
    //     (Neg zero check)
    //     (Bailout code)
    //   $doneLabel:

    IR::LabelInstr *doneLabel = skipBailOutLabel, *slowPathLabel;

    if (!doneLabel)
    {
        doneLabel = IR::LabelInstr::New(Js::OpCode::Label, remInstr->m_func);
        remInstr->InsertAfter(doneLabel);
    }
    slowPathLabel = IR::LabelInstr::New(Js::OpCode::Label, remInstr->m_func, isModByPowerOf2);
    remInstr->InsertBefore(slowPathLabel);

    // test s1, s1
    InsertTest(src1, src1, slowPathLabel);

    // jsb $slowPathLabel
    InsertBranch(LowererMD::MDCompareWithZeroBranchOpcode(Js::OpCode::BrLt_A), slowPathLabel, slowPathLabel);

    // s3 = and s1, 0x00..fff (2^i - 1)
    IR::Opnd* maskOpnd;

    if(isModByPowerOf2)
    {
        Assert(isModByPowerOf2);
        maskOpnd = IR::RegOpnd::New(TyInt32, remInstr->m_func);

        // mov maskOpnd, s2
        InsertMove(maskOpnd, src2, slowPathLabel);

        // dec maskOpnd
        InsertSub(/*needFlags*/ true, maskOpnd, maskOpnd, IR::IntConstOpnd::New(1, TyInt32, this->m_func, /*dontEncode*/true), slowPathLabel);

        // maskOpnd < 0 goto $slowPath
        InsertBranch(LowererMD::MDCompareWithZeroBranchOpcode(Js::OpCode::BrLt_A), slowPathLabel, slowPathLabel);

        // TEST src2, maskOpnd
        InsertTestBranch(src2, maskOpnd, Js::OpCode::BrNeq_A, slowPathLabel, slowPathLabel);
    }
    else
    {
        Assert(src2->IsIntConstOpnd());
        int32 mask =  src2->AsIntConstOpnd()->AsInt32() - 1;
        maskOpnd = IR::IntConstOpnd::New(mask, TyInt32, remInstr->m_func);
    }

    // dst = src1 & maskOpnd
    InsertAnd(dst, src1, maskOpnd, slowPathLabel);

    // jmp $doneLabel
    InsertBranch(Js::OpCode::Br, doneLabel, slowPathLabel);
    return true;
}